

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# redexpress.cpp
# Opt level: O0

void addSustainPedalling(MidiFile *midifile,int sourcetrack,int targettrack)

{
  bool bVar1;
  int iVar2;
  MidiEventList *pMVar3;
  MidiEvent *pMVar4;
  int key;
  int local_5c;
  undefined1 local_58 [4];
  int i;
  MidiEvent me;
  int count;
  int targettrack_local;
  int sourcetrack_local;
  MidiFile *midifile_local;
  
  me.m_eventlink._4_4_ = smf::MidiFile::getEventCount(midifile,sourcetrack);
  smf::MidiEvent::MidiEvent((MidiEvent *)local_58);
  me.super_MidiMessage.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = targettrack;
  for (local_5c = 0; local_5c < me.m_eventlink._4_4_; local_5c = local_5c + 1) {
    pMVar3 = smf::MidiFile::operator[](midifile,sourcetrack);
    pMVar4 = smf::MidiEventList::operator[](pMVar3,local_5c);
    bVar1 = smf::MidiMessage::isNoteOn(&pMVar4->super_MidiMessage);
    if (bVar1) {
      pMVar3 = smf::MidiFile::operator[](midifile,sourcetrack);
      pMVar4 = smf::MidiEventList::operator[](pMVar3,local_5c);
      iVar2 = smf::MidiMessage::getKeyNumber(&pMVar4->super_MidiMessage);
      pMVar3 = smf::MidiFile::operator[](midifile,sourcetrack);
      pMVar4 = smf::MidiEventList::operator[](pMVar3,local_5c);
      me.super_MidiMessage.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = pMVar4->tick;
      if (iVar2 == PedalOnKey) {
        smf::MidiMessage::makeController((MidiMessage *)local_58,1,0x40,0x7f);
        smf::MidiFile::addEvent(midifile,(MidiEvent *)local_58);
        smf::MidiMessage::makeController((MidiMessage *)local_58,2,0x40,0x7f);
        smf::MidiFile::addEvent(midifile,(MidiEvent *)local_58);
      }
      else if (iVar2 == PedalOffKey) {
        smf::MidiMessage::makeController((MidiMessage *)local_58,1,0x40,0);
        smf::MidiFile::addEvent(midifile,(MidiEvent *)local_58);
        smf::MidiMessage::makeController((MidiMessage *)local_58,2,0x40,0);
        smf::MidiFile::addEvent(midifile,(MidiEvent *)local_58);
      }
    }
  }
  smf::MidiEvent::~MidiEvent((MidiEvent *)local_58);
  return;
}

Assistant:

void addSustainPedalling(MidiFile& midifile, int sourcetrack, int targettrack) {
	int count = midifile.getEventCount(sourcetrack);
	MidiEvent me;
	me.track = targettrack;
	for (int i=0; i<count; i++) {
		if (!midifile[sourcetrack][i].isNoteOn()) {
			continue;
		}
		int key = midifile[sourcetrack][i].getKeyNumber();
		me.tick = midifile[sourcetrack][i].tick;
		if (key == PedalOnKey) {
			me.makeController(1, 64, 127);
			midifile.addEvent(me);
			me.makeController(2, 64, 127);
			midifile.addEvent(me);
		} else if (key == PedalOffKey) {
			me.makeController(1, 64, 0);
			midifile.addEvent(me);
			me.makeController(2, 64, 0);
			midifile.addEvent(me);
		}
	}
}